

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBSpStructMatrix.cpp
# Opt level: O3

TPZStructMatrix * __thiscall
TPZBSpStructMatrix<double,_TPZStructMatrixOT<double>_>::Clone
          (TPZBSpStructMatrix<double,_TPZStructMatrixOT<double>_> *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0x130);
  lVar1 = *(long *)(*(long *)&(this->super_TPZSpStructMatrix<double,_TPZStructMatrixOT<double>_>).
                              super_TPZStructMatrixT<double>.super_TPZStructMatrix + -0x60);
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19dacd0;
  *(undefined8 *)this_00 = 0x19dad98;
  *(undefined4 *)&this_00[1].fEquationFilter.fActiveEqs.fNAlloc =
       *(undefined4 *)
        ((long)&(this->super_TPZSpStructMatrix<double,_TPZStructMatrixOT<double>_>).
                super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh + lVar1);
  *(undefined1 *)((long)&this_00[1].fEquationFilter.fActiveEqs.fNAlloc + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZSpStructMatrix<double,_TPZStructMatrixOT<double>_>).
                super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh + lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019da320,(TPZStructMatrix *)this);
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19da7a0;
  *(undefined8 *)this_00 = 0x19da6c0;
  TPZStructMatrixOT<double>::TPZStructMatrixOT
            ((TPZStructMatrixOT<double> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019da348,
             (TPZStructMatrixOT<double> *)
             &(this->super_TPZSpStructMatrix<double,_TPZStructMatrixOT<double>_>).
              super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0);
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19da298;
  *(undefined8 *)this_00 = 0x19da0c0;
  *(undefined8 *)&this_00->field_0xa0 = 0x19da190;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZBSpStructMatrix(*this);
}